

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O2

void Io_NtkWrite(FILE *pFile,Abc_Ntk_t *pNtk,int fWriteLatches,int fBb2Wb,int fSeq)

{
  Abc_Ntk_t *pNtk_00;
  
  if (pNtk->ntkType == ABC_NTK_NETLIST) {
    fprintf((FILE *)pFile,".model %s\n",pNtk->pName);
    Io_NtkWriteOne(pFile,pNtk,fWriteLatches,fBb2Wb,fSeq);
    pNtk_00 = pNtk->pExdc;
    if (pNtk_00 != (Abc_Ntk_t *)0x0) {
      fputc(10,(FILE *)pFile);
      fwrite(".exdc\n",6,1,(FILE *)pFile);
      Io_NtkWriteOne(pFile,pNtk_00,fWriteLatches,fBb2Wb,fSeq);
    }
    fwrite(".end\n",5,1,(FILE *)pFile);
    return;
  }
  __assert_fail("Abc_NtkIsNetlist(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioWriteBlif.c"
                ,0x82,"void Io_NtkWrite(FILE *, Abc_Ntk_t *, int, int, int)");
}

Assistant:

void Io_NtkWrite( FILE * pFile, Abc_Ntk_t * pNtk, int fWriteLatches, int fBb2Wb, int fSeq )
{
    Abc_Ntk_t * pExdc;
    assert( Abc_NtkIsNetlist(pNtk) );
    // write the model name
    fprintf( pFile, ".model %s\n", Abc_NtkName(pNtk) );
    // write the network
    Io_NtkWriteOne( pFile, pNtk, fWriteLatches, fBb2Wb, fSeq );
    // write EXDC network if it exists
    pExdc = Abc_NtkExdc( pNtk );
    if ( pExdc )
    {
        fprintf( pFile, "\n" );
        fprintf( pFile, ".exdc\n" );
        Io_NtkWriteOne( pFile, pExdc, fWriteLatches, fBb2Wb, fSeq );
    }
    // finalize the file
    fprintf( pFile, ".end\n" );
}